

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIOption.h
# Opt level: O0

void __thiscall libchess::UCIOption<int>::set_option(UCIOption<int> *this,value_type *value)

{
  function<void_(const_int_&)> *in_RSI;
  long in_RDI;
  int *in_stack_ffffffffffffffe8;
  
  *(undefined4 *)(in_RDI + 0x28) = *(undefined4 *)&(in_RSI->super__Function_base)._M_functor;
  std::function<void_(const_int_&)>::operator()(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

virtual void set_option(const value_type& value) noexcept {
        value_ = value;
        handler_(value);
    }